

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopDfs.c
# Opt level: O1

void Hop_ManDfs_rec(Hop_Obj_t *pObj,Vec_Ptr_t *vNodes)

{
  uint uVar1;
  void **ppvVar2;
  int iVar3;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Hop_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/hop/hopDfs.c"
                  ,0x2f,"void Hop_ManDfs_rec(Hop_Obj_t *, Vec_Ptr_t *)");
  }
  if ((*(uint *)&pObj->field_0x20 & 0x16) != 4) {
    return;
  }
  Hop_ManDfs_rec((Hop_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),vNodes);
  Hop_ManDfs_rec((Hop_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),vNodes);
  if ((*(uint *)&pObj->field_0x20 & 0x10) != 0) {
    __assert_fail("!Hop_ObjIsMarkA(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/hop/hopDfs.c"
                  ,0x34,"void Hop_ManDfs_rec(Hop_Obj_t *, Vec_Ptr_t *)");
  }
  *(uint *)&pObj->field_0x20 = *(uint *)&pObj->field_0x20 | 0x10;
  uVar1 = vNodes->nCap;
  if (vNodes->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vNodes->pArray == (void **)0x0) {
        ppvVar2 = (void **)malloc(0x80);
      }
      else {
        ppvVar2 = (void **)realloc(vNodes->pArray,0x80);
      }
      vNodes->pArray = ppvVar2;
      iVar3 = 0x10;
    }
    else {
      iVar3 = uVar1 * 2;
      if (iVar3 <= (int)uVar1) goto LAB_007629c4;
      if (vNodes->pArray == (void **)0x0) {
        ppvVar2 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar2 = (void **)realloc(vNodes->pArray,(ulong)uVar1 << 4);
      }
      vNodes->pArray = ppvVar2;
    }
    vNodes->nCap = iVar3;
  }
LAB_007629c4:
  iVar3 = vNodes->nSize;
  vNodes->nSize = iVar3 + 1;
  vNodes->pArray[iVar3] = pObj;
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Collects internal nodes in the DFS order.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Hop_ManDfs_rec( Hop_Obj_t * pObj, Vec_Ptr_t * vNodes )
{
    assert( !Hop_IsComplement(pObj) );
    if ( !Hop_ObjIsNode(pObj) || Hop_ObjIsMarkA(pObj) )
        return;
    Hop_ManDfs_rec( Hop_ObjFanin0(pObj), vNodes );
    Hop_ManDfs_rec( Hop_ObjFanin1(pObj), vNodes );
    assert( !Hop_ObjIsMarkA(pObj) ); // loop detection
    Hop_ObjSetMarkA(pObj);
    Vec_PtrPush( vNodes, pObj );
}